

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_converter_get_input_channel_map
                    (ma_data_converter *pConverter,ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (pChannelMap != (ma_channel *)0x0 && pConverter != (ma_data_converter *)0x0) {
    if (pConverter->hasChannelConverter == '\0') {
      mVar1 = MA_SUCCESS;
      ma_channel_map_init_standard
                (ma_standard_channel_map_default,pChannelMap,channelMapCap,pConverter->channelsOut);
    }
    else {
      ma_channel_map_copy_or_default
                (pChannelMap,channelMapCap,(pConverter->channelConverter).pChannelMapOut,
                 (pConverter->channelConverter).channelsOut);
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_converter_get_input_channel_map(const ma_data_converter* pConverter, ma_channel* pChannelMap, size_t channelMapCap)
{
    if (pConverter == NULL || pChannelMap == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConverter->hasChannelConverter) {
        ma_channel_converter_get_output_channel_map(&pConverter->channelConverter, pChannelMap, channelMapCap);
    } else {
        ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pConverter->channelsOut);
    }

    return MA_SUCCESS;
}